

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

CaseStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CaseStatementSyntax,slang::syntax::NamedLabelSyntax*&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::CaseItemSyntax>const&,slang::parsing::Token&>
          (BumpAllocator *this,NamedLabelSyntax **args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,Token *args_2,Token *args_3,
          Token *args_4,ExpressionSyntax *args_5,Token *args_6,Token *args_7,
          SyntaxList<slang::syntax::CaseItemSyntax> *args_8,Token *args_9)

{
  size_type sVar1;
  pointer ppCVar2;
  Info *pIVar3;
  Info *pIVar4;
  Info *pIVar5;
  Info *pIVar6;
  Info *pIVar7;
  Info *pIVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  TokenKind TVar13;
  undefined1 uVar14;
  NumericTokenFlags NVar15;
  uint32_t uVar16;
  TokenKind TVar17;
  undefined1 uVar18;
  NumericTokenFlags NVar19;
  uint32_t uVar20;
  TokenKind TVar21;
  undefined1 uVar22;
  NumericTokenFlags NVar23;
  uint32_t uVar24;
  TokenKind TVar25;
  undefined1 uVar26;
  NumericTokenFlags NVar27;
  uint32_t uVar28;
  SyntaxKind SVar29;
  undefined4 uVar30;
  TokenKind TVar31;
  undefined1 uVar32;
  NumericTokenFlags NVar33;
  uint32_t uVar34;
  long lVar35;
  CaseStatementSyntax *this_00;
  
  this_00 = (CaseStatementSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((CaseStatementSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (CaseStatementSyntax *)allocateSlow(this,0xe0,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  TVar9 = args_2->kind;
  uVar10 = args_2->field_0x2;
  NVar11.raw = (args_2->numFlags).raw;
  uVar12 = args_2->rawLen;
  pIVar3 = args_2->info;
  TVar13 = args_3->kind;
  uVar14 = args_3->field_0x2;
  NVar15.raw = (args_3->numFlags).raw;
  uVar16 = args_3->rawLen;
  pIVar4 = args_3->info;
  TVar17 = args_4->kind;
  uVar18 = args_4->field_0x2;
  NVar19.raw = (args_4->numFlags).raw;
  uVar20 = args_4->rawLen;
  pIVar5 = args_4->info;
  TVar21 = args_6->kind;
  uVar22 = args_6->field_0x2;
  NVar23.raw = (args_6->numFlags).raw;
  uVar24 = args_6->rawLen;
  pIVar6 = args_6->info;
  TVar25 = args_7->kind;
  uVar26 = args_7->field_0x2;
  NVar27.raw = (args_7->numFlags).raw;
  uVar28 = args_7->rawLen;
  pIVar7 = args_7->info;
  TVar31 = args_9->kind;
  uVar32 = args_9->field_0x2;
  NVar33.raw = (args_9->numFlags).raw;
  uVar34 = args_9->rawLen;
  pIVar8 = args_9->info;
  slang::syntax::StatementSyntax::StatementSyntax
            (&this_00->super_StatementSyntax,CaseStatement,*args,args_1);
  (this_00->uniqueOrPriority).kind = TVar9;
  (this_00->uniqueOrPriority).field_0x2 = uVar10;
  (this_00->uniqueOrPriority).numFlags = (NumericTokenFlags)NVar11.raw;
  (this_00->uniqueOrPriority).rawLen = uVar12;
  (this_00->uniqueOrPriority).info = pIVar3;
  (this_00->caseKeyword).kind = TVar13;
  (this_00->caseKeyword).field_0x2 = uVar14;
  (this_00->caseKeyword).numFlags = (NumericTokenFlags)NVar15.raw;
  (this_00->caseKeyword).rawLen = uVar16;
  (this_00->caseKeyword).info = pIVar4;
  (this_00->openParen).kind = TVar17;
  (this_00->openParen).field_0x2 = uVar18;
  (this_00->openParen).numFlags = (NumericTokenFlags)NVar19.raw;
  (this_00->openParen).rawLen = uVar20;
  (this_00->openParen).info = pIVar5;
  (this_00->expr).ptr = args_5;
  (this_00->closeParen).kind = TVar21;
  (this_00->closeParen).field_0x2 = uVar22;
  (this_00->closeParen).numFlags = (NumericTokenFlags)NVar23.raw;
  (this_00->closeParen).rawLen = uVar24;
  (this_00->closeParen).info = pIVar6;
  (this_00->matchesOrInside).kind = TVar25;
  (this_00->matchesOrInside).field_0x2 = uVar26;
  (this_00->matchesOrInside).numFlags = (NumericTokenFlags)NVar27.raw;
  (this_00->matchesOrInside).rawLen = uVar28;
  (this_00->matchesOrInside).info = pIVar7;
  SVar29 = (args_8->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar30 = *(undefined4 *)&(args_8->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this_00->items).super_SyntaxListBase.super_SyntaxNode.parent =
       (args_8->super_SyntaxListBase).super_SyntaxNode.parent;
  (this_00->items).super_SyntaxListBase.super_SyntaxNode.kind = SVar29;
  *(undefined4 *)&(this_00->items).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar30;
  (this_00->items).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_004e9f08;
  (this_00->items).super_SyntaxListBase.childCount = (args_8->super_SyntaxListBase).childCount;
  sVar1 = (args_8->super_span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>).size_;
  (this_00->items).super_span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>.data_ =
       (args_8->super_span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>).data_;
  (this_00->items).super_span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>.size_ = sVar1
  ;
  (this_00->items).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_004ecf10;
  (this_00->endcase).kind = TVar31;
  (this_00->endcase).field_0x2 = uVar32;
  (this_00->endcase).numFlags = (NumericTokenFlags)NVar33.raw;
  (this_00->endcase).rawLen = uVar34;
  (this_00->endcase).info = pIVar8;
  (args_5->super_SyntaxNode).parent = (SyntaxNode *)this_00;
  (this_00->items).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this_00;
  sVar1 = (this_00->items).super_span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>.size_
  ;
  if (sVar1 != 0) {
    ppCVar2 = (this_00->items).super_span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>.
              data_;
    lVar35 = 0;
    do {
      **(undefined8 **)((long)ppCVar2 + lVar35) = this_00;
      lVar35 = lVar35 + 8;
    } while (sVar1 << 3 != lVar35);
  }
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }